

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale.h
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
fmt::v5::internal::vformat<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,locale *loc,basic_string_view<wchar_t> format_str,
          basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          args)

{
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *buf;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> local_7f8;
  
  local_7f8.super_basic_buffer<wchar_t>.ptr_ = local_7f8.store_;
  local_7f8.super_basic_buffer<wchar_t>.size_ = 0;
  local_7f8.super_basic_buffer<wchar_t>._vptr_basic_buffer = (_func_int **)&PTR_grow_001620d8;
  local_7f8.super_basic_buffer<wchar_t>.capacity_ = 500;
  vformat_to<wchar_t>(loc,&local_7f8.super_basic_buffer<wchar_t>,format_str,args);
  to_string<wchar_t,500ul>(__return_storage_ptr__,(v5 *)&local_7f8,buf);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer(&local_7f8);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> vformat(
    const std::locale &loc, basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(loc, buffer, format_str, args);
  return fmt::to_string(buffer);
}